

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O0

void * __thiscall
axl::io::MappedFile::view
          (MappedFile *this,uint64_t offset,size_t size,size_t *actualSize,bool isPermanent)

{
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  bool in_stack_0000000f;
  void *p;
  uint64_t actualEnd;
  uint64_t end;
  undefined7 in_stack_00000028;
  undefined8 local_40;
  undefined8 local_8;
  
  if (in_RDX == 0) {
    File::getSize((File *)0x16f97d);
  }
  local_8 = viewImpl((MappedFile *)CONCAT17(isPermanent,in_stack_00000028),end,actualEnd,
                     (uint64_t *)p,in_stack_0000000f);
  if (local_8 == (void *)0x0) {
    local_8 = (void *)0x0;
  }
  else if (in_RCX != (long *)0x0) {
    *in_RCX = local_40 - in_RSI;
  }
  return local_8;
}

Assistant:

void*
MappedFile::view(
	uint64_t offset,
	size_t size,
	size_t* actualSize,
	bool isPermanent
) {
	uint64_t end = size ? offset + size : m_file.getSize();

	uint64_t actualEnd;
	void* p = viewImpl(offset, end, &actualEnd, isPermanent);
	if (!p)
		return NULL;

	if (actualSize)
		*actualSize = (size_t)(actualEnd - offset);

	return p;
}